

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::flip_y(mipmapped_texture *this,bool update_orientation_flags)

{
  bool bVar1;
  uint uVar2;
  mip_ptr_vec *pmVar3;
  mip_level **ppmVar4;
  orientation_flags_t local_84;
  uint local_80;
  uint orient_flags;
  uint m;
  uint f;
  undefined1 local_68 [8];
  mipmapped_texture temp_tex;
  bool update_orientation_flags_local;
  mipmapped_texture *this_local;
  
  temp_tex.m_last_error.m_pStr._7_1_ = update_orientation_flags;
  mipmapped_texture((mipmapped_texture *)local_68,this);
  bVar1 = flip_y_helper((mipmapped_texture *)local_68);
  if (!bVar1) {
    operator=((mipmapped_texture *)local_68,this);
    unpack_from_dxt((mipmapped_texture *)local_68,true);
    bVar1 = flip_y_helper((mipmapped_texture *)local_68);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_001529b4;
    }
  }
  swap(this,(mipmapped_texture *)local_68);
  if ((temp_tex.m_last_error.m_pStr._7_1_ & 1) != 0) {
    for (orient_flags = 0; uVar2 = get_num_faces(this), orient_flags < uVar2;
        orient_flags = orient_flags + 1) {
      local_80 = 0;
      while( true ) {
        pmVar3 = get_face(this,orient_flags);
        uVar2 = vector<crnlib::mip_level_*>::size(pmVar3);
        if (uVar2 <= local_80) break;
        pmVar3 = get_face(this,orient_flags);
        ppmVar4 = vector<crnlib::mip_level_*>::operator[](pmVar3,local_80);
        local_84 = mip_level::get_orientation_flags(*ppmVar4);
        local_84 = local_84 ^ cOrientationFlagYFlipped;
        pmVar3 = get_face(this,orient_flags);
        ppmVar4 = vector<crnlib::mip_level_*>::operator[](pmVar3,local_80);
        mip_level::set_orientation_flags(*ppmVar4,local_84);
        local_80 = local_80 + 1;
      }
    }
  }
  this_local._7_1_ = true;
LAB_001529b4:
  ~mipmapped_texture((mipmapped_texture *)local_68);
  return this_local._7_1_;
}

Assistant:

bool mipmapped_texture::flip_y(bool update_orientation_flags) {
  mipmapped_texture temp_tex(*this);
  if (!temp_tex.flip_y_helper()) {
    temp_tex = *this;
    temp_tex.unpack_from_dxt(true);
    if (!temp_tex.flip_y_helper())
      return false;
  }
  swap(temp_tex);

  if (update_orientation_flags) {
    for (uint f = 0; f < get_num_faces(); f++) {
      for (uint m = 0; m < get_face(f).size(); m++) {
        uint orient_flags = get_face(f)[m]->get_orientation_flags();
        orient_flags ^= cOrientationFlagYFlipped;
        get_face(f)[m]->set_orientation_flags(static_cast<orientation_flags_t>(orient_flags));
      }
    }
  }

  CRNLIB_ASSERT(check());

  return true;
}